

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorArraySum_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLchar *array_name,
          GLuint columns,GLuint size)

{
  GLchar *vector_name;
  string local_90;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string name;
  size_t position;
  GLuint i;
  GLuint size_local;
  GLuint columns_local;
  GLchar *array_name_local;
  InitializerListTest *this_local;
  string *sum;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (position._0_4_ = 0; (uint)position < columns; position._0_4_ = (uint)position + 1) {
    name.field_2._8_8_ = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,array_name,&local_59);
    std::allocator<char>::~allocator(&local_59);
    Utils::replaceToken("INDEX",(size_t *)(name.field_2._M_local_buf + 8),
                        getVectorArraySum::lut[(uint)position],(string *)local_58);
    vector_name = (GLchar *)std::__cxx11::string::c_str();
    getVectorSum_abi_cxx11_(&local_90,this,vector_name,size);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_90);
    if ((uint)position + 1 < columns) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorArraySum(const GLchar* array_name, GLuint columns, GLuint size)
{
	static const GLchar* lut[] = { "0", "1", "2", "3" };

	std::string sum;

	for (GLuint i = 0; i < columns; ++i)
	{
		size_t		position = 0;
		std::string name	 = array_name;

		Utils::replaceToken("INDEX", position, lut[i], name);

		sum.append(getVectorSum(name.c_str(), size));

		if (i + 1 < columns)
		{
			sum.append(" + ");
		}
	}

	return sum;
}